

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::SetNoArena
          (ArenaStringPtr *this,string *default_value,string *value)

{
  string *this_00;
  
  if (this->ptr_ != default_value) {
    std::__cxx11::string::operator=((string *)this->ptr_,(string *)value);
    return;
  }
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)value);
  this->ptr_ = this_00;
  return;
}

Assistant:

void SetNoArena(const ::std::string* default_value, ::std::string&& value) {
    if (IsDefault(default_value)) {
      ptr_ = new ::std::string(std::move(value));
    } else {
      *ptr_ = std::move(value);
    }
  }